

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubDSectorIterator::Initialize
          (ON_SubDSectorIterator *this,ON_SubDFace *initial_face,ON__UINT_PTR iterator_orientation,
          ON_SubDVertex *center_vertex)

{
  ulong uVar1;
  ON_SubDVertex *pOVar2;
  uint local_54;
  ON_SubDEdgePtr *pOStack_50;
  uint efi;
  ON_SubDEdgePtr *face_eptr;
  uint edge_count;
  ON_SubDEdge *edge;
  ON__UINT_PTR eptr;
  ON_SubDVertex *center_vertex_local;
  ON__UINT_PTR iterator_orientation_local;
  ON_SubDFace *initial_face_local;
  ON_SubDSectorIterator *this_local;
  
  if ((center_vertex != (ON_SubDVertex *)0x0) && (initial_face != (ON_SubDFace *)0x0)) {
    pOStack_50 = initial_face->m_edge4;
    local_54 = 0;
    while ((local_54 < initial_face->m_edge_count &&
           ((local_54 != 4 ||
            (pOStack_50 = initial_face->m_edgex, pOStack_50 != (ON_SubDEdgePtr *)0x0))))) {
      uVar1 = pOStack_50->m_ptr & 0xfffffffffffffff8;
      if ((uVar1 != 0) &&
         (center_vertex == *(ON_SubDVertex **)(uVar1 + 0x80 + (pOStack_50->m_ptr & 1) * 8))) {
        pOVar2 = Initialize(this,initial_face,iterator_orientation,local_54);
        return pOVar2;
      }
      local_54 = local_54 + 1;
      pOStack_50 = pOStack_50 + 1;
    }
  }
  Initialize(this);
  ON_SubDIncrementErrorCount();
  return (ON_SubDVertex *)0x0;
}

Assistant:

const ON_SubDVertex* ON_SubDSectorIterator::Initialize(
  const ON_SubDFace* initial_face,
  ON__UINT_PTR iterator_orientation,
  const ON_SubDVertex* center_vertex
  )
{
  if (nullptr != center_vertex && nullptr != initial_face)
  {
    ON__UINT_PTR eptr;
    const ON_SubDEdge* edge;
    const unsigned int edge_count = initial_face->m_edge_count;
    const ON_SubDEdgePtr* face_eptr = initial_face->m_edge4;
    for (unsigned int efi = 0; efi < edge_count; efi++, face_eptr++)
    {
      if (4 == efi)
      {
        face_eptr = initial_face->m_edgex;
        if (nullptr == face_eptr)
          break;
      }
      eptr = face_eptr->m_ptr;
      edge = ON_SUBD_EDGE_POINTER(eptr);
      if (nullptr == edge)
        continue;
      eptr = ON_SUBD_EDGE_DIRECTION(eptr);
      if (center_vertex == edge->m_vertex[eptr])
        return Initialize(initial_face, iterator_orientation, efi);
    }
  }

  Initialize();
  return ON_SUBD_RETURN_ERROR(nullptr);
}